

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TSPI_PDU.cpp
# Opt level: O0

void __thiscall KDIS::PDU::TSPI_PDU::SetMeasuredSpeed(TSPI_PDU *this,KFIXED16_3 *S)

{
  KFIXED<short,_(unsigned_char)__x03_> local_38;
  KFIXED<short,_(unsigned_char)__x03_> local_28;
  KFIXED16_3 *local_18;
  KFIXED16_3 *S_local;
  TSPI_PDU *this_local;
  
  local_18 = S;
  S_local = (KFIXED16_3 *)this;
  SetMeasuredSpeedFlag(this,true);
  DATA_TYPE::KFIXED<short,_(unsigned_char)'\x03'>::KFIXED(&local_38,S);
  DATA_TYPE::KFIXED<short,_(unsigned_char)'\x03'>::operator=(&local_28,&this->m_MeasureSpd);
  DATA_TYPE::KFIXED<short,_(unsigned_char)'\x03'>::~KFIXED(&local_28);
  DATA_TYPE::KFIXED<short,_(unsigned_char)'\x03'>::~KFIXED(&local_38);
  return;
}

Assistant:

void TSPI_PDU::SetMeasuredSpeed( KFIXED16_3 S )
{
    SetMeasuredSpeedFlag( true );
    m_MeasureSpd = S;
}